

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O3

bool closeEnough(string *reference,string *attempt,uint minLength)

{
  int iVar1;
  bool bVar2;
  long *local_40 [2];
  long local_30 [2];
  
  iVar1 = strcasecmp((reference->_M_dataplus)._M_p,(attempt->_M_dataplus)._M_p);
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
    if (((ulong)minLength <= attempt->_M_string_length) &&
       (attempt->_M_string_length < reference->_M_string_length)) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)reference);
      iVar1 = strcasecmp((char *)local_40[0],(attempt->_M_dataplus)._M_p);
      bVar2 = iVar1 == 0;
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
  }
  return bVar2;
}

Assistant:

bool closeEnough (
  const std::string& reference,
  const std::string& attempt,
  unsigned int minLength /* = 0 */)
{
  // An exact match is accepted first.
  if (compare (reference, attempt, false))
    return true;

  // A partial match will suffice.
  if (attempt.length () < reference.length () &&
      attempt.length () >= minLength)
    return compare (reference.substr (0, attempt.length ()), attempt, false);

  return false;
}